

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O3

pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
__thiscall
phmap::priv::hash_internal::
Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
::operator()(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *__return_storage_ptr__,
            Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
            *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  result_type_conflict1 rVar2;
  mt19937_64 *__urng;
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_31;
  param_type local_30;
  string local_28;
  
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_28,&local_31);
  local_30._M_a = 0;
  local_30._M_b = 0x7fffffff;
  __urng = GetSharedRng();
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_30,__urng,&local_30);
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p == &local_28.field_2) {
    paVar1->_M_allocated_capacity = local_28.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_28.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_28._M_dataplus._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity =
         local_28.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->first)._M_string_length = local_28._M_string_length;
  __return_storage_ptr__->second = rVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<K, V> operator()() const {
        return std::pair<K, V>(Generator<typename std::decay<K>::type>()(),
                               Generator<typename std::decay<V>::type>()());
    }